

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_unitsNotEqualDifferingOrderOfUnits_Test::TestBody
          (Equality_unitsNotEqualDifferingOrderOfUnits_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  AssertionResult local_88;
  long local_78 [2];
  long *local_68;
  long *local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  long local_50 [2];
  AssertHelper local_40 [8];
  string *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_88._0_8_ = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unitsA","");
  libcellml::Units::create((string *)&local_28);
  if ((string *)local_88._0_8_ != (string *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unitsA","");
  libcellml::Units::create((string *)&local_38);
  if ((string *)local_88._0_8_ != (string *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  psVar1 = local_28;
  local_88._0_8_ = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"metre","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  libcellml::Units::addUnit(psVar1,3.0,(string *)&local_88);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((string *)local_88._0_8_ != (string *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  psVar1 = local_28;
  local_88._0_8_ = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"second","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"unit_id","");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_88);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((string *)local_88._0_8_ != (string *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  psVar1 = local_38;
  local_88._0_8_ = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"second","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"unit_id","");
  libcellml::Units::addUnit(psVar1,2.0,(string *)&local_88);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((string *)local_88._0_8_ != (string *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  psVar1 = local_38;
  local_88._0_8_ = (string *)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"metre","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  libcellml::Units::addUnit(psVar1,3.0,(string *)&local_88);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((string *)local_88._0_8_ != (string *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = local_38;
  local_88.message_.ptr_ = local_30;
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_30->_M_string_length = (int)local_30->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_30->_M_string_length = (int)local_30->_M_string_length + 1;
    }
  }
  cVar2 = libcellml::Entity::equals((shared_ptr *)local_28);
  local_60 = (long *)(CONCAT71(local_60._1_7_,cVar2) ^ 1);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar2 != '\0') goto LAB_00116e50;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.message_.ptr_);
    if (((ulong)local_60 & 1) == 0) {
LAB_00116e50:
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_88,(char *)&local_60,"u1->equals(u2)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x154,(char *)local_88._0_8_);
      testing::internal::AssertHelper::operator=(local_40,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(local_40);
      if ((string *)local_88._0_8_ != (string *)local_78) {
        operator_delete((void *)local_88._0_8_,local_78[0] + 1);
      }
      if (((local_68 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_68 != (long *)0x0)) {
        (**(code **)(*local_68 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88._0_8_ = local_28;
  local_88.message_.ptr_ = local_20;
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_20->_M_string_length = (int)local_20->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_20->_M_string_length = (int)local_20->_M_string_length + 1;
    }
  }
  cVar2 = libcellml::Entity::equals((shared_ptr *)local_38);
  local_60 = (long *)(CONCAT71(local_60._1_7_,cVar2) ^ 1);
  local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar2 == '\0') goto LAB_0011700b;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.message_.ptr_);
    if (((ulong)local_60 & 1) != 0) goto LAB_0011700b;
  }
  testing::Message::Message((Message *)&local_68);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_88,(char *)&local_60,"u2->equals(u1)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x155,(char *)local_88._0_8_);
  testing::internal::AssertHelper::operator=(local_40,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(local_40);
  if ((string *)local_88._0_8_ != (string *)local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (((local_68 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_68 != (long *)0x0)) {
    (**(code **)(*local_68 + 8))();
  }
LAB_0011700b:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}